

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

Maybe<capnp::compiler::Module_&> __thiscall
capnp::SchemaParser::ModuleImpl::importRelative(ModuleImpl *this,StringPtr importPath)

{
  long *plVar1;
  SchemaFile *pSVar2;
  ModuleImpl *pMVar3;
  OwnOwn<capnp::SchemaFile,_std::nullptr_t> _importedFile96;
  Own<capnp::SchemaFile,_std::nullptr_t> local_40;
  Own<capnp::SchemaFile,_std::nullptr_t> local_30;
  
  plVar1 = *(long **)(importPath.content.ptr + 0x18);
  (**(code **)(*plVar1 + 0x10))(&local_30,plVar1,importPath.content.size_);
  pSVar2 = local_30.ptr;
  local_40.disposer = local_30.disposer;
  local_40.ptr = local_30.ptr;
  local_30.ptr = (SchemaFile *)0x0;
  kj::Own<capnp::SchemaFile,_std::nullptr_t>::dispose(&local_30);
  if (pSVar2 == (SchemaFile *)0x0) {
    pMVar3 = (ModuleImpl *)0x0;
  }
  else {
    pMVar3 = getModuleImpl(*(SchemaParser **)(importPath.content.ptr + 8),&local_40);
  }
  (this->super_Module).super_ErrorReporter._vptr_ErrorReporter = (_func_int **)pMVar3;
  kj::Own<capnp::SchemaFile,_std::nullptr_t>::dispose(&local_40);
  return (Maybe<capnp::compiler::Module_&>)&this->super_Module;
}

Assistant:

kj::Maybe<Module&> importRelative(kj::StringPtr importPath) override {
    KJ_IF_SOME(importedFile, file->import(importPath)) {
      return parser.getModuleImpl(kj::mv(importedFile));
    } else {
      return kj::none;
    }